

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_output.hpp
# Opt level: O2

void write_output<std::vector<unsigned_short,std::allocator<unsigned_short>>>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *primes,endian output_endian
               ,ostream *os)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
             (long)(primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  if (output_endian == native) {
    puVar1 = (primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (ushort *)local_38._M_impl.super__Vector_impl_data._M_start;
    for (puVar3 = (primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar2 = *puVar3;
      puVar2 = puVar2 + 1;
    }
  }
  else if (output_endian == big) {
    puVar1 = (primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (ushort *)local_38._M_impl.super__Vector_impl_data._M_start;
    for (puVar3 = (primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar2 = *puVar3 << 8 | *puVar3 >> 8;
      puVar2 = puVar2 + 1;
    }
  }
  else if (output_endian == little) {
    puVar1 = (primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (ushort *)local_38._M_impl.super__Vector_impl_data._M_start;
    for (puVar3 = (primes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar2 = *puVar3;
      puVar2 = puVar2 + 1;
    }
  }
  std::ostream::write((char *)os,(long)local_38._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void write_output (ContainerType const & primes, endian output_endian, std::ostream & os) {

    using int_type = typename ContainerType::value_type;
    std::vector<std::uint8_t> bytes;
    bytes.resize (primes.size () * sizeof (int_type));
    auto ptr = bytes.data ();
    switch (output_endian) {
    case endian::big:
        for (auto v : primes) {
            ptr = write<int_type, endian::big> (v, ptr);
        }
        break;
    case endian::little:
        for (auto v : primes) {
            ptr = write<int_type, endian::little> (v, ptr);
        }
        break;
    case endian::native:
        for (auto v : primes) {
            ptr = write<int_type, endian::native> (v, ptr);
        }
        break;
    }
    os.write (reinterpret_cast<std::ofstream::char_type const *> (bytes.data ()),
              static_cast<std::streamsize> (sizeof (std::uint8_t) * bytes.size ()));
}